

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O1

void Gia_ManEraHashResize(Gia_ManEra_t *p)

{
  uint uVar1;
  uint *__ptr;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  Gia_ObjEra_t *pState;
  
  __ptr = p->pBins;
  if (__ptr == (uint *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                  ,0xea,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
  }
  uVar1 = p->nBins;
  uVar4 = uVar1 * 3 - 1;
  while( true ) {
    do {
      uVar5 = uVar4 + 1;
      uVar2 = uVar4 & 1;
      uVar4 = uVar5;
    } while (uVar2 != 0);
    if (uVar5 < 9) break;
    iVar8 = 5;
    while (uVar5 % (iVar8 - 2U) != 0) {
      uVar2 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar5 < uVar2) goto LAB_006944bd;
    }
  }
LAB_006944bd:
  p->nBins = uVar5;
  puVar3 = (uint *)calloc((long)(int)uVar5,4);
  p->pBins = puVar3;
  if ((int)uVar1 < 1) {
    iVar8 = 0;
  }
  else {
    uVar9 = 0;
    iVar8 = 0;
    do {
      uVar4 = __ptr[uVar9];
      if ((ulong)uVar4 == 0) {
        pState = (Gia_ObjEra_t *)0x0;
      }
      else {
        if (((int)uVar4 < 0) || (p->vStates->nSize <= (int)uVar4)) {
LAB_006945b5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pState = (Gia_ObjEra_t *)p->vStates->pArray[uVar4];
      }
      if (pState == (Gia_ObjEra_t *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)(uint)pState->iNext;
      }
      while (pState != (Gia_ObjEra_t *)0x0) {
        if (pState->Num == 0) {
          __assert_fail("pThis->Num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                        ,0xf8,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
        }
        pState->iNext = 0;
        puVar3 = Gia_ManEraHashFind(p,pState,(int *)0x0);
        if (*puVar3 != 0) {
          __assert_fail("*piPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                        ,0xfb,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
        }
        *puVar3 = pState->Num;
        iVar6 = (int)uVar7;
        if (iVar6 == 0) {
          pState = (Gia_ObjEra_t *)0x0;
        }
        else {
          if ((iVar6 < 0) || (p->vStates->nSize <= iVar6)) goto LAB_006945b5;
          pState = (Gia_ObjEra_t *)p->vStates->pArray[uVar7];
        }
        if (pState == (Gia_ObjEra_t *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (ulong)(uint)pState->iNext;
        }
        iVar8 = iVar8 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  if (iVar8 != p->vStates->nSize + -1) {
    __assert_fail("Counter == Vec_PtrSize( p->vStates ) - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                  ,0xff,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManEraHashResize( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pThis;
    unsigned * pBinsOld, * piPlace;
    int nBinsOld, iNext, Counter, i;
    assert( p->pBins != NULL );
    // replace the table
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( unsigned, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pThis = (pBinsOld[i]? Gia_ManEraState(p, pBinsOld[i]) : NULL),
          iNext = (pThis? pThis->iNext : 0);  
          pThis;  pThis = (iNext? Gia_ManEraState(p, iNext) : NULL),   
          iNext = (pThis? pThis->iNext : 0)  )
    {
        assert( pThis->Num );
        pThis->iNext = 0;
        piPlace = Gia_ManEraHashFind( p, pThis, NULL );
        assert( *piPlace == 0 ); // should not be there
        *piPlace = pThis->Num;
        Counter++;
    }
    assert( Counter == Vec_PtrSize( p->vStates ) - 1 );
    ABC_FREE( pBinsOld );
}